

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int automataTest(char *filename,char *result,char *err,int options)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  FILE *__stream;
  char *__filename;
  FILE *pFVar5;
  char *pcVar6;
  size_t sVar7;
  xmlAutomataStatePtr pxVar8;
  undefined8 *puVar9;
  byte bVar10;
  ulong uVar11;
  xmlAutomataStatePtr pxVar12;
  size_t sStackY_3360;
  char *ptr;
  long local_3348;
  long local_3340;
  xmlAutomataStatePtr local_3338;
  FILE *local_3330;
  long local_3328;
  undefined8 local_3320;
  ulong local_3318;
  undefined8 local_3310;
  char expr [5000];
  xmlAutomataStatePtr states [1000];
  
  nb_tests = nb_tests + 1;
  for (lVar4 = 0; lVar4 != 1000; lVar4 = lVar4 + 1) {
    states[lVar4] = (xmlAutomataStatePtr)0x0;
  }
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puVar9 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar9;
    puVar9 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar9,"Cannot open %s for reading\n",filename);
  }
  else {
    __filename = resultFilename(filename,"",".res");
    if (__filename == (char *)0x0) {
      fwrite("Out of memory\n",0xe,1,_stderr);
      fatalError();
    }
    pFVar5 = fopen64(__filename,"wb");
    if (pFVar5 == (FILE *)0x0) {
      fprintf(_stderr,"failed to open output file %s\n",__filename);
      free(__filename);
    }
    else {
      lVar4 = xmlNewAutomata();
      if (lVar4 == 0) {
        puVar9 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar9;
        puVar9 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar9,"Cannot create automata\n");
      }
      else {
        states[0] = (xmlAutomataStatePtr)xmlAutomataGetInitState(lVar4);
        if (states[0] != (xmlAutomataStatePtr)0x0) {
          local_3328 = 0;
          local_3348 = lVar4;
          local_3330 = pFVar5;
          local_3310 = result;
LAB_00109d62:
          local_3340 = 0;
LAB_00109d6b:
          local_3320 = 0;
LAB_00109d74:
          do {
            do {
              pcVar6 = fgets(expr,0x1194,__stream);
              cVar2 = expr[0];
              if (pcVar6 == (char *)0x0) {
LAB_0010a346:
                fclose(local_3330);
                fclose(__stream);
                pcVar6 = local_3310;
                lVar4 = local_3348;
                if (local_3340 != 0) {
                  xmlRegFreeRegexp();
                }
                if (local_3328 != 0) {
                  xmlRegFreeExecCtxt();
                }
                if (lVar4 != 0) {
                  xmlFreeAutomata(lVar4);
                }
                iVar3 = compareFiles(__filename,pcVar6);
                if (iVar3 != 0) {
                  fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar6);
                }
                unlink(__filename);
                free(__filename);
                return (uint)(iVar3 != 0);
              }
            } while (expr[0] == '#');
            sVar7 = strlen(expr);
            lVar4 = local_3348;
            pcVar6 = expr + (int)sVar7;
            for (uVar11 = sVar7 & 0xffffffff; 0 < (int)(uint)uVar11; uVar11 = uVar11 - 1) {
              if ((0x20 < (ulong)(byte)expr[uVar11 - 1]) ||
                 ((0x100002600U >> ((ulong)(byte)expr[uVar11 - 1] & 0x3f) & 1) == 0)) {
                expr[(uint)uVar11 & 0x7fffffff] = '\0';
                bVar10 = expr[1] ^ 0x20;
                if ((cVar2 == 't' && bVar10 == 0) && local_3348 != 0) {
                  ptr = expr + 2;
                  iVar3 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    uVar11 = (ulong)iVar3;
                    pxVar8 = states[uVar11];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348);
                      states[uVar11] = pxVar8;
                    }
                    ptr = ptr + 1;
                    local_3338 = pxVar8;
                    iVar3 = scanNumber(&ptr);
                    if (*ptr == ' ') {
                      pxVar8 = states[iVar3];
                      pxVar12 = local_3338;
                      local_3318 = uVar11;
                      if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                        pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348,local_3338);
                        states[iVar3] = pxVar8;
                        pxVar12 = states[local_3318];
                      }
                      ptr = ptr + 1;
                      xmlAutomataNewTransition(local_3348,pxVar12,pxVar8,ptr,0);
                      goto LAB_00109d74;
                    }
                  }
                }
                else if ((cVar2 == 'e' && bVar10 == 0) && local_3348 != 0) {
                  ptr = expr + 2;
                  iVar3 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    pxVar12 = (xmlAutomataStatePtr)(long)iVar3;
                    pxVar8 = states[(long)pxVar12];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348);
                      states[(long)pxVar12] = pxVar8;
                    }
                    ptr = ptr + 1;
                    local_3338 = pxVar12;
                    iVar3 = scanNumber(&ptr);
                    pxVar12 = states[iVar3];
                    if (pxVar12 == (xmlAutomataStatePtr)0x0) {
                      pxVar12 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348,pxVar8);
                      states[iVar3] = pxVar12;
                      pxVar8 = states[(long)local_3338];
                    }
                    xmlAutomataNewEpsilon(local_3348,pxVar8,pxVar12);
                    goto LAB_00109d74;
                  }
                }
                else {
                  if ((cVar2 == 'f' && bVar10 == 0) && local_3348 != 0) {
                    ptr = expr + 2;
                    iVar3 = scanNumber(&ptr);
                    if (states[iVar3] == (xmlAutomataStatePtr)0x0) {
                      puVar9 = (undefined8 *)__xmlGenericError();
                      pcVar1 = (code *)*puVar9;
                      puVar9 = (undefined8 *)__xmlGenericErrorContext();
                      (*pcVar1)(*puVar9,"Bad state %d : %s\n",iVar3,expr);
                      goto LAB_0010a346;
                    }
                    xmlAutomataSetFinalState(local_3348);
                    goto LAB_00109d74;
                  }
                  if ((cVar2 != 'c' || bVar10 != 0) || local_3348 == 0) {
                    if ((expr[1] == '-' && cVar2 == '-') && local_3348 != 0) {
                      local_3340 = xmlAutomataCompile();
                      xmlFreeAutomata(lVar4);
                      local_3348 = 0;
                      if (local_3340 != 0) goto LAB_00109d74;
                      puVar9 = (undefined8 *)__xmlGenericError();
                      pcVar1 = (code *)*puVar9;
                      puVar9 = (undefined8 *)__xmlGenericErrorContext();
                      local_3340 = 0;
                      (*pcVar1)(*puVar9,"Failed to compile the automata");
                      local_3348 = 0;
                      goto LAB_0010a346;
                    }
                    if (expr[1] != '>' || cVar2 != '=') {
                      if (local_3340 == 0) {
                        puVar9 = (undefined8 *)__xmlGenericError();
                        pcVar1 = (code *)*puVar9;
                        puVar9 = (undefined8 *)__xmlGenericErrorContext();
                        (*pcVar1)(*puVar9,"Unexpected line %s\n",expr);
                        local_3340 = 0;
                      }
                      else {
                        if (local_3328 == 0) {
                          local_3328 = xmlRegNewExecCtxt(local_3340,0,0);
                        }
                        local_3320 = xmlRegExecPushString(local_3328,expr,0);
                      }
                      goto LAB_00109d74;
                    }
                    if (local_3340 == 0) {
                      fwrite("=> failed not compiled\n",0x17,1,local_3330);
                      goto LAB_00109d62;
                    }
                    lVar4 = local_3328;
                    if (local_3328 == 0) {
                      lVar4 = xmlRegNewExecCtxt(local_3340,0,0);
                    }
                    iVar3 = (int)local_3320;
                    if (iVar3 == 0) {
                      iVar3 = xmlRegExecPushString(lVar4,0,0);
                    }
                    if (iVar3 == 1) {
                      pcVar6 = "=> Passed\n";
LAB_0010a23e:
                      sStackY_3360 = 10;
LAB_0010a240:
                      fwrite(pcVar6,sStackY_3360,1,local_3330);
                    }
                    else {
                      if (iVar3 + 1U < 2) {
                        pcVar6 = "=> Failed\n";
                        goto LAB_0010a23e;
                      }
                      if (iVar3 < 0) {
                        pcVar6 = "=> Error\n";
                        sStackY_3360 = 9;
                        goto LAB_0010a240;
                      }
                    }
                    xmlRegFreeExecCtxt(lVar4);
                    local_3328 = 0;
                    goto LAB_00109d6b;
                  }
                  ptr = expr + 2;
                  iVar3 = scanNumber(&ptr);
                  if (*ptr != ' ') goto LAB_0010a325;
                  pxVar8 = (xmlAutomataStatePtr)(long)iVar3;
                  if (states[(long)pxVar8] == (xmlAutomataStatePtr)0x0) {
                    pxVar12 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348);
                    states[(long)pxVar8] = pxVar12;
                  }
                  ptr = ptr + 1;
                  local_3338 = pxVar8;
                  iVar3 = scanNumber(&ptr);
                  if (*ptr == ' ') {
                    pxVar8 = states[iVar3];
                    if (pxVar8 == (xmlAutomataStatePtr)0x0) {
                      pxVar8 = (xmlAutomataStatePtr)xmlAutomataNewState(local_3348);
                      states[iVar3] = pxVar8;
                    }
                    ptr = ptr + 1;
                    iVar3 = scanNumber(&ptr);
                    local_3318 = CONCAT44(local_3318._4_4_,iVar3);
                    if (*ptr == ' ') {
                      ptr = ptr + 1;
                      iVar3 = scanNumber(&ptr);
                      if (*ptr == ' ') {
                        ptr = ptr + 1;
                        xmlAutomataNewCountTrans
                                  (local_3348,states[(long)local_3338],pxVar8,ptr,
                                   local_3318 & 0xffffffff,iVar3,0);
                        goto LAB_00109d74;
                      }
                    }
                  }
                }
LAB_0010a325:
                puVar9 = (undefined8 *)__xmlGenericError();
                pcVar1 = (code *)*puVar9;
                puVar9 = (undefined8 *)__xmlGenericErrorContext();
                (*pcVar1)(*puVar9,"Bad line %s\n",expr);
                goto LAB_0010a346;
              }
              pcVar6 = pcVar6 + -1;
            }
            *pcVar6 = '\0';
          } while( true );
        }
        puVar9 = (undefined8 *)__xmlGenericError();
        pcVar1 = (code *)*puVar9;
        puVar9 = (undefined8 *)__xmlGenericErrorContext();
        (*pcVar1)(*puVar9,"Cannot get start state\n");
        xmlFreeAutomata(lVar4);
      }
      fclose(__stream);
    }
  }
  return -1;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    xmlGenericError(xmlGenericErrorContext,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    xmlGenericError(xmlGenericErrorContext,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		xmlGenericError(xmlGenericErrorContext,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}